

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O2

tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL,_7UL,_8UL,_9UL,_10UL,_11UL,_12UL,_13UL,_14UL,_15UL,_16UL,_17UL,_18UL,_19UL,_20UL,_21UL,_22UL>,_Fixpp::FieldRef<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<366U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<81U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<92U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<208U,_Fixpp::Type::Boolean>_>,_Fixpp::FieldRef<Fixpp::TagT<209U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<161U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<360U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<361U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<12U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<13U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<153U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<154U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<119U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<120U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<155U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<156U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<159U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>
* __thiscall
meta::impl::
tuple_base<std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul,21ul,22ul>,Fixpp::FieldRef<Fixpp::TagT<79u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<366u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<80u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<81u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<92u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<208u,Fixpp::Type::Boolean>>,Fixpp::FieldRef<Fixpp::TagT<209u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<161u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<360u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<361u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<12u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<13u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<153u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<154u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<119u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<120u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<155u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<156u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<159u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<160u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<136u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<137u,Fixpp::Type::Float>,Fixpp::TagT<138u,Fixpp::Type::String>,Fixpp::TagT<139u,Fixpp::Type::Char>>>>
::operator=(tuple_base<std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul,21ul,22ul>,Fixpp::FieldRef<Fixpp::TagT<79u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<366u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<80u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<81u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<92u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<208u,Fixpp::Type::Boolean>>,Fixpp::FieldRef<Fixpp::TagT<209u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<161u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<360u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<361u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<12u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<13u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<153u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<154u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<119u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<120u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<155u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<156u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<159u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<160u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<136u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<137u,Fixpp::Type::Float>,Fixpp::TagT<138u,Fixpp::Type::String>,Fixpp::TagT<139u,Fixpp::Type::Char>>>>
            *this,tuple<Fixpp::FieldRef<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<366U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<81U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<92U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<208U,_Fixpp::Type::Boolean>_>,_Fixpp::FieldRef<Fixpp::TagT<209U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<161U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<360U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<361U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<12U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<13U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<153U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<154U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<119U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<120U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<155U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<156U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<159U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>
                  *v)

{
  *(char **)this =
       (v->base).
       super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 8) =
       (v->base).
       super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x10) =
       (v->base).
       super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<366U,_Fixpp::Type::Float>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x18) =
       (v->base).
       super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<366U,_Fixpp::Type::Float>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x20) =
       (v->base).
       super_tuple_value<2UL,_Fixpp::FieldRef<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x28) =
       (v->base).
       super_tuple_value<2UL,_Fixpp::FieldRef<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x30) =
       (v->base).
       super_tuple_value<3UL,_Fixpp::FieldRef<Fixpp::TagT<81U,_Fixpp::Type::Char>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x38) =
       (v->base).
       super_tuple_value<3UL,_Fixpp::FieldRef<Fixpp::TagT<81U,_Fixpp::Type::Char>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x40) =
       (v->base).
       super_tuple_value<4UL,_Fixpp::FieldRef<Fixpp::TagT<92U,_Fixpp::Type::String>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x48) =
       (v->base).
       super_tuple_value<4UL,_Fixpp::FieldRef<Fixpp::TagT<92U,_Fixpp::Type::String>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x50) =
       (v->base).
       super_tuple_value<5UL,_Fixpp::FieldRef<Fixpp::TagT<208U,_Fixpp::Type::Boolean>_>,_false>.
       value.m_view.first;
  *(unsigned_long *)(this + 0x58) =
       (v->base).
       super_tuple_value<5UL,_Fixpp::FieldRef<Fixpp::TagT<208U,_Fixpp::Type::Boolean>_>,_false>.
       value.m_view.second;
  *(char **)(this + 0x60) =
       (v->base).
       super_tuple_value<6UL,_Fixpp::FieldRef<Fixpp::TagT<209U,_Fixpp::Type::Int>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x68) =
       (v->base).
       super_tuple_value<6UL,_Fixpp::FieldRef<Fixpp::TagT<209U,_Fixpp::Type::Int>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x70) =
       (v->base).
       super_tuple_value<7UL,_Fixpp::FieldRef<Fixpp::TagT<161U,_Fixpp::Type::String>_>,_false>.value
       .m_view.first;
  *(unsigned_long *)(this + 0x78) =
       (v->base).
       super_tuple_value<7UL,_Fixpp::FieldRef<Fixpp::TagT<161U,_Fixpp::Type::String>_>,_false>.value
       .m_view.second;
  *(char **)(this + 0x80) =
       (v->base).
       super_tuple_value<8UL,_Fixpp::FieldRef<Fixpp::TagT<360U,_Fixpp::Type::Int>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x88) =
       (v->base).
       super_tuple_value<8UL,_Fixpp::FieldRef<Fixpp::TagT<360U,_Fixpp::Type::Int>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x90) =
       (v->base).
       super_tuple_value<9UL,_Fixpp::FieldRef<Fixpp::TagT<361U,_Fixpp::Type::Data>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x98) =
       (v->base).
       super_tuple_value<9UL,_Fixpp::FieldRef<Fixpp::TagT<361U,_Fixpp::Type::Data>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0xa0) =
       (v->base).
       super_tuple_value<10UL,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_false>.value
       .m_view.first;
  *(unsigned_long *)(this + 0xa8) =
       (v->base).
       super_tuple_value<10UL,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_false>.value
       .m_view.second;
  *(char **)(this + 0xb0) =
       (v->base).
       super_tuple_value<11UL,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_false>.
       value.m_view.first;
  *(unsigned_long *)(this + 0xb8) =
       (v->base).
       super_tuple_value<11UL,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_false>.
       value.m_view.second;
  *(char **)(this + 0xc0) =
       (v->base).
       super_tuple_value<12UL,_Fixpp::FieldRef<Fixpp::TagT<12U,_Fixpp::Type::Float>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 200) =
       (v->base).
       super_tuple_value<12UL,_Fixpp::FieldRef<Fixpp::TagT<12U,_Fixpp::Type::Float>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0xd0) =
       (v->base).
       super_tuple_value<13UL,_Fixpp::FieldRef<Fixpp::TagT<13U,_Fixpp::Type::Char>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0xd8) =
       (v->base).
       super_tuple_value<13UL,_Fixpp::FieldRef<Fixpp::TagT<13U,_Fixpp::Type::Char>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0xe0) =
       (v->base).
       super_tuple_value<14UL,_Fixpp::FieldRef<Fixpp::TagT<153U,_Fixpp::Type::Float>_>,_false>.value
       .m_view.first;
  *(unsigned_long *)(this + 0xe8) =
       (v->base).
       super_tuple_value<14UL,_Fixpp::FieldRef<Fixpp::TagT<153U,_Fixpp::Type::Float>_>,_false>.value
       .m_view.second;
  *(char **)(this + 0xf0) =
       (v->base).
       super_tuple_value<15UL,_Fixpp::FieldRef<Fixpp::TagT<154U,_Fixpp::Type::Float>_>,_false>.value
       .m_view.first;
  *(unsigned_long *)(this + 0xf8) =
       (v->base).
       super_tuple_value<15UL,_Fixpp::FieldRef<Fixpp::TagT<154U,_Fixpp::Type::Float>_>,_false>.value
       .m_view.second;
  *(char **)(this + 0x100) =
       (v->base).
       super_tuple_value<16UL,_Fixpp::FieldRef<Fixpp::TagT<119U,_Fixpp::Type::Float>_>,_false>.value
       .m_view.first;
  *(unsigned_long *)(this + 0x108) =
       (v->base).
       super_tuple_value<16UL,_Fixpp::FieldRef<Fixpp::TagT<119U,_Fixpp::Type::Float>_>,_false>.value
       .m_view.second;
  *(char **)(this + 0x110) =
       (v->base).
       super_tuple_value<17UL,_Fixpp::FieldRef<Fixpp::TagT<120U,_Fixpp::Type::String>_>,_false>.
       value.m_view.first;
  *(unsigned_long *)(this + 0x118) =
       (v->base).
       super_tuple_value<17UL,_Fixpp::FieldRef<Fixpp::TagT<120U,_Fixpp::Type::String>_>,_false>.
       value.m_view.second;
  *(char **)(this + 0x120) =
       (v->base).
       super_tuple_value<18UL,_Fixpp::FieldRef<Fixpp::TagT<155U,_Fixpp::Type::Float>_>,_false>.value
       .m_view.first;
  *(unsigned_long *)(this + 0x128) =
       (v->base).
       super_tuple_value<18UL,_Fixpp::FieldRef<Fixpp::TagT<155U,_Fixpp::Type::Float>_>,_false>.value
       .m_view.second;
  *(char **)(this + 0x130) =
       (v->base).
       super_tuple_value<19UL,_Fixpp::FieldRef<Fixpp::TagT<156U,_Fixpp::Type::Char>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x138) =
       (v->base).
       super_tuple_value<19UL,_Fixpp::FieldRef<Fixpp::TagT<156U,_Fixpp::Type::Char>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x140) =
       (v->base).
       super_tuple_value<20UL,_Fixpp::FieldRef<Fixpp::TagT<159U,_Fixpp::Type::Float>_>,_false>.value
       .m_view.first;
  *(unsigned_long *)(this + 0x148) =
       (v->base).
       super_tuple_value<20UL,_Fixpp::FieldRef<Fixpp::TagT<159U,_Fixpp::Type::Float>_>,_false>.value
       .m_view.second;
  *(char **)(this + 0x150) =
       (v->base).
       super_tuple_value<21UL,_Fixpp::FieldRef<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x158) =
       (v->base).
       super_tuple_value<21UL,_Fixpp::FieldRef<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_false>.value.
       m_view.second;
  llvm::
  SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>
  ::operator=((SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>
               *)(this + 0x160),
              (SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>
               *)&(v->base).
                  super_tuple_value<22UL,_Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>,_false>
             );
  return (tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL,_7UL,_8UL,_9UL,_10UL,_11UL,_12UL,_13UL,_14UL,_15UL,_16UL,_17UL,_18UL,_19UL,_20UL,_21UL,_22UL>,_Fixpp::FieldRef<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<366U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<81U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<92U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<208U,_Fixpp::Type::Boolean>_>,_Fixpp::FieldRef<Fixpp::TagT<209U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<161U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<360U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<361U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<12U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<13U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<153U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<154U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<119U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<120U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<155U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<156U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<159U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>_>
          *)this;
}

Assistant:

tuple_base& operator=( const tuple< Us... >& v )
        noexcept( seq::is_all< std::is_nothrow_assignable< Ts&, const Us& >::value... >::value )
      {
#ifdef FIXPP_META_FOLD_EXPRESSIONS
        ( tuple_value< Is, Ts >::operator=( get< Is >( v ) ), ... );
#else
        (void)swallow{ ( tuple_value< Is, Ts >::operator=( meta::get< Is >( v ) ), true )..., true };
#endif
        return *this;
      }